

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicsFloatOrParam::setParamValue
          (KinematicsFloatOrParam *this,String *paramValue)

{
  String *this_00;
  string *in_RSI;
  KinematicsFloatOrParam *in_RDI;
  
  deleteParam(in_RDI);
  this_00 = (String *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,in_RSI);
  (in_RDI->mValue)._param = this_00;
  in_RDI->mValueType = VALUETYPE_PARAM;
  return;
}

Assistant:

void setParamValue( const String& paramValue) { deleteParam(); mValue._param = new String(paramValue); mValueType = VALUETYPE_PARAM; }